

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session.c
# Opt level: O1

char * libssh2_session_banner_get(LIBSSH2_SESSION *session)

{
  if (session != (LIBSSH2_SESSION *)0x0) {
    return (char *)(session->remote).banner;
  }
  return (char *)0x0;
}

Assistant:

LIBSSH2_API const char *
libssh2_session_banner_get(LIBSSH2_SESSION *session)
{
    /* to avoid a coredump when session is NULL */
    if(!session)
        return NULL;

    if(!session->remote.banner)
        return NULL;

    return (const char *) session->remote.banner;
}